

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double orient3dadapt(double *pa,double *pb,double *pc,double *pd,double permanent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint elen;
  int iVar4;
  int iVar5;
  int flen;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  double *e;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double u [4];
  double ct_b [4];
  double ct_a [4];
  double bt_a [4];
  double bt_c [4];
  double at_c [4];
  double at_b [4];
  double ab [4];
  double ca [4];
  double bc [4];
  double w [16];
  double v [12];
  double abt [8];
  double cat [8];
  double bct [8];
  double adet [8];
  double cdet [8];
  double bdet [8];
  double abdet [16];
  double fin1 [192];
  double fin2 [192];
  double local_1088;
  double local_1080;
  double local_1078;
  double local_1070;
  double local_1068;
  double local_1060;
  double local_1058;
  double local_1050;
  double local_1048;
  double local_1040;
  double local_1038;
  double local_1030;
  double local_1028;
  double local_1020;
  double local_1018;
  double local_1010;
  double local_1008;
  double local_1000;
  double local_ff8;
  double local_ff0;
  double local_fe8;
  double local_fe0;
  double local_fd8;
  double local_fd0;
  double local_fc8;
  double local_fc0;
  double local_fb8;
  double local_fb0;
  double local_fa8;
  double local_fa0;
  double local_f98;
  double local_f90;
  double local_f88;
  double local_f80;
  double local_f78;
  double local_f70;
  double local_f68;
  double local_f60;
  double local_f58;
  double local_f50;
  double local_f48;
  double local_f40;
  double local_f38;
  double local_f30;
  double local_f28;
  double local_f20;
  double local_f18 [16];
  double local_e98 [12];
  double local_e38 [8];
  double local_df8 [8];
  double local_db8 [8];
  double local_d78 [8];
  double local_d38 [8];
  double local_cf8 [8];
  double local_cb8 [16];
  double local_c38 [192];
  double local_638 [193];
  
  dVar39 = splitter;
  dVar22 = *pd;
  dVar31 = pd[1];
  dVar34 = *pb;
  dVar13 = dVar34 - dVar22;
  dVar38 = *pc;
  dVar46 = pc[1];
  dVar32 = dVar46 - dVar31;
  dVar44 = dVar13 * dVar32;
  dVar23 = dVar13 * splitter - (dVar13 * splitter - dVar13);
  dVar28 = dVar13 - dVar23;
  dVar35 = dVar32 * splitter - (dVar32 * splitter - dVar32);
  dVar40 = dVar32 - dVar35;
  dVar10 = dVar28 * dVar40 - (((dVar44 - dVar23 * dVar35) - dVar28 * dVar35) - dVar23 * dVar40);
  dVar24 = dVar38 - dVar22;
  dVar16 = dVar24 * splitter - (dVar24 * splitter - dVar24);
  dVar12 = pb[1];
  dVar17 = dVar12 - dVar31;
  local_1068 = dVar17 * splitter - (dVar17 * splitter - dVar17);
  local_f80 = dVar24 * dVar17;
  dVar36 = dVar24 - dVar16;
  local_1060 = dVar17 - local_1068;
  dVar14 = dVar36 * local_1060 -
           (((local_f80 - dVar16 * local_1068) - dVar36 * local_1068) - dVar16 * local_1060);
  dVar18 = dVar10 - dVar14;
  local_f38 = (dVar10 - (dVar18 + (dVar10 - dVar18))) + ((dVar10 - dVar18) - dVar14);
  dVar10 = *pa;
  dVar14 = pa[1];
  dVar15 = pa[2];
  dVar25 = pd[2];
  dVar26 = pb[2];
  dVar27 = pc[2];
  dVar11 = dVar44 + dVar18;
  dVar18 = (dVar44 - (dVar11 - (dVar11 - dVar44))) + (dVar18 - (dVar11 - dVar44));
  dVar19 = dVar18 - local_f80;
  local_f30 = (dVar18 - (dVar19 + (dVar18 - dVar19))) + ((dVar18 - dVar19) - local_f80);
  local_f20 = dVar11 + dVar19;
  local_f28 = (dVar11 - (local_f20 - (local_f20 - dVar11))) + (dVar19 - (local_f20 - dVar11));
  dVar43 = dVar10 - dVar22;
  dVar42 = dVar14 - dVar31;
  dVar11 = dVar15 - dVar25;
  dVar37 = dVar26 - dVar25;
  dVar33 = dVar27 - dVar25;
  iVar1 = scale_expansion_zeroelim(4,&local_f38,dVar11,local_d78);
  local_f88 = dVar24 * dVar42;
  dVar20 = dVar42 * dVar39 - (dVar42 * dVar39 - dVar42);
  dVar29 = dVar42 - dVar20;
  dVar18 = dVar36 * dVar29 - (((local_f88 - dVar16 * dVar20) - dVar36 * dVar20) - dVar16 * dVar29);
  local_f90 = dVar43 * dVar32;
  dVar30 = dVar43 * dVar39 - (dVar43 * dVar39 - dVar43);
  dVar41 = dVar43 - dVar30;
  dVar19 = dVar41 * dVar40 - (((local_f90 - dVar30 * dVar35) - dVar41 * dVar35) - dVar30 * dVar40);
  dVar21 = dVar18 - dVar19;
  local_f58 = (dVar18 - (dVar21 + (dVar18 - dVar21))) + ((dVar18 - dVar21) - dVar19);
  dVar18 = local_f88 + dVar21;
  dVar19 = (local_f88 - (dVar18 - (dVar18 - local_f88))) + (dVar21 - (dVar18 - local_f88));
  dVar21 = dVar19 - local_f90;
  local_f50 = (dVar19 - (dVar21 + (dVar19 - dVar21))) + ((dVar19 - dVar21) - local_f90);
  local_f40 = dVar18 + dVar21;
  local_f48 = (dVar18 - (local_f40 - (local_f40 - dVar18))) + (dVar21 - (local_f40 - dVar18));
  iVar2 = scale_expansion_zeroelim(4,&local_f58,dVar37,local_cf8);
  dVar21 = dVar43 * dVar17;
  dVar41 = dVar41 * local_1060 -
           (((dVar21 - dVar30 * local_1068) - dVar41 * local_1068) - dVar30 * local_1060);
  dVar30 = dVar13 * dVar42;
  dVar18 = dVar29 * dVar28 - (((dVar30 - dVar23 * dVar20) - dVar20 * dVar28) - dVar23 * dVar29);
  dVar19 = dVar41 - dVar18;
  local_f78 = (dVar41 - (dVar19 + (dVar41 - dVar19))) + ((dVar41 - dVar19) - dVar18);
  dVar18 = dVar21 + dVar19;
  dVar20 = (dVar21 - (dVar18 - (dVar18 - dVar21))) + (dVar19 - (dVar18 - dVar21));
  dVar19 = dVar20 - dVar30;
  local_f70 = (dVar20 - (dVar19 + (dVar20 - dVar19))) + ((dVar20 - dVar19) - dVar30);
  local_f60 = dVar18 + dVar19;
  local_f68 = (dVar18 - (local_f60 - (local_f60 - dVar18))) + (dVar19 - (local_f60 - dVar18));
  iVar3 = scale_expansion_zeroelim(4,&local_f78,dVar33,local_d38);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,local_d78,iVar2,local_cf8,local_cb8);
  pdVar7 = local_c38;
  elen = fast_expansion_sum_zeroelim(iVar1,local_cb8,iVar3,local_d38,pdVar7);
  if (1 < (int)elen) {
    uVar6 = 1;
    do {
      local_c38[0] = local_c38[0] + local_c38[uVar6];
      uVar6 = uVar6 + 1;
    } while (elen != uVar6);
  }
  if (o3derrboundB * permanent <= local_c38[0]) {
    return local_c38[0];
  }
  if (o3derrboundB * permanent <= -local_c38[0]) {
    return local_c38[0];
  }
  dVar10 = (dVar10 - (dVar43 + (dVar10 - dVar43))) + ((dVar10 - dVar43) - dVar22);
  dVar19 = (dVar34 - (dVar13 + (dVar34 - dVar13))) + ((dVar34 - dVar13) - dVar22);
  dVar18 = (dVar38 - (dVar24 + (dVar38 - dVar24))) + ((dVar38 - dVar24) - dVar22);
  dVar14 = (dVar14 - (dVar42 + (dVar14 - dVar42))) + ((dVar14 - dVar42) - dVar31);
  dVar38 = (dVar12 - (dVar17 + (dVar12 - dVar17))) + ((dVar12 - dVar17) - dVar31);
  dVar46 = (dVar46 - (dVar32 + (dVar46 - dVar32))) + ((dVar46 - dVar32) - dVar31);
  dVar34 = (dVar15 - (dVar11 + (dVar15 - dVar11))) + ((dVar15 - dVar11) - dVar25);
  dVar31 = (dVar26 - (dVar37 + (dVar26 - dVar37))) + ((dVar26 - dVar37) - dVar25);
  dVar22 = (dVar27 - (dVar33 + (dVar27 - dVar33))) + ((dVar27 - dVar33) - dVar25);
  if ((((((dVar10 == 0.0) && (!NAN(dVar10))) && (dVar19 == 0.0)) &&
       ((!NAN(dVar19) && (dVar18 == 0.0)))) &&
      (((!NAN(dVar18) && ((dVar14 == 0.0 && (!NAN(dVar14))))) && (dVar38 == 0.0)))) &&
     (((((!NAN(dVar38) && (dVar46 == 0.0)) && (!NAN(dVar46))) &&
       (((dVar34 == 0.0 && (!NAN(dVar34))) &&
        ((dVar31 == 0.0 && ((!NAN(dVar31) && (dVar22 == 0.0)))))))) && (!NAN(dVar22))))) {
    return local_c38[0];
  }
  dVar41 = permanent * o3derrboundC + ABS(local_c38[0]) * resulterrbound;
  dVar15 = dVar19 * dVar32;
  dVar12 = dVar13 * dVar46;
  local_f98 = dVar24 * dVar38;
  dVar25 = dVar17 * dVar18;
  dVar26 = dVar42 * dVar18;
  dVar49 = dVar24 * dVar14;
  dVar27 = dVar43 * dVar46;
  dVar45 = dVar32 * dVar10;
  dVar47 = dVar10 * dVar17;
  dVar20 = dVar43 * dVar38;
  dVar48 = dVar13 * dVar14;
  dVar29 = dVar42 * dVar19;
  local_c38[0] = ((dVar20 + dVar47) - (dVar29 + dVar48)) * dVar33 + (dVar21 - dVar30) * dVar22 +
                 ((dVar49 + dVar26) - (dVar45 + dVar27)) * dVar37 + (local_f88 - local_f90) * dVar31
                 + ((dVar12 + dVar15) - (dVar25 + local_f98)) * dVar11 +
                   (dVar44 - local_f80) * dVar34 + local_c38[0];
  if (dVar41 <= local_c38[0]) {
    return local_c38[0];
  }
  if (dVar41 <= -local_c38[0]) {
    return local_c38[0];
  }
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    dVar30 = dVar10 * dVar39 - (dVar10 * dVar39 - dVar10);
    dVar21 = dVar10 - dVar30;
    local_fb8 = local_1060 * dVar21 -
                (((dVar47 - dVar30 * local_1068) - local_1068 * dVar21) - dVar30 * local_1060);
    if ((dVar14 != 0.0) || (NAN(dVar14))) {
      dVar41 = dVar39 * dVar14 - (dVar39 * dVar14 - dVar14);
      dVar44 = dVar14 - dVar41;
      dVar39 = dVar28 * dVar44 - (((dVar48 - dVar41 * dVar23) - dVar23 * dVar44) - dVar41 * dVar28);
      dVar23 = local_fb8 - dVar39;
      local_fb8 = (local_fb8 - (dVar23 + (local_fb8 - dVar23))) + ((local_fb8 - dVar23) - dVar39);
      dVar28 = dVar47 + dVar23;
      dVar23 = (dVar47 - (dVar28 - (dVar28 - dVar47))) + (dVar23 - (dVar28 - dVar47));
      dVar39 = dVar23 - dVar48;
      local_fb0 = (dVar23 - (dVar39 + (dVar23 - dVar39))) + ((dVar23 - dVar39) - dVar48);
      local_fa0 = dVar28 + dVar39;
      local_fa8 = (dVar28 - (local_fa0 - (local_fa0 - dVar28))) + (dVar39 - (local_fa0 - dVar28));
      dVar23 = dVar44 * dVar36 - (((dVar49 - dVar41 * dVar16) - dVar16 * dVar44) - dVar41 * dVar36);
      dVar39 = dVar21 * dVar40 - (-dVar30 * dVar40 + -dVar21 * dVar35 + -dVar30 * dVar35 + dVar45);
      dVar16 = dVar23 - dVar39;
      local_fd8 = (dVar23 - (dVar16 + (dVar23 - dVar16))) + ((dVar23 - dVar16) - dVar39);
      dVar39 = dVar49 + dVar16;
      dVar21 = (dVar49 - (dVar39 - (dVar39 - dVar49))) + (dVar16 - (dVar39 - dVar49));
      dVar16 = dVar21 - dVar45;
      local_fd0 = (dVar21 - (dVar16 + (dVar21 - dVar16))) + ((dVar21 - dVar16) - dVar45);
      local_fc0 = dVar39 + dVar16;
      local_fc8 = (dVar39 - (local_fc0 - (local_fc0 - dVar39))) + (dVar16 - (local_fc0 - dVar39));
      iVar1 = 4;
    }
    else {
      dVar16 = -dVar10;
      dVar39 = dVar39 * dVar16 - (dVar10 + dVar39 * dVar16);
      local_fd8 = (dVar16 - dVar39) * dVar40 -
                  (((dVar32 * dVar16 - dVar39 * dVar35) - dVar35 * (dVar16 - dVar39)) -
                  dVar39 * dVar40);
      iVar1 = 2;
      local_fd0 = dVar32 * dVar16;
      local_fb0 = dVar47;
    }
  }
  else if ((dVar14 != 0.0) || (NAN(dVar14))) {
    dVar21 = -dVar14;
    local_fb0 = dVar13 * dVar21;
    dVar30 = dVar39 * dVar21 - (dVar14 + dVar39 * dVar21);
    local_fb8 = (dVar21 - dVar30) * dVar28 -
                (((local_fb0 - dVar30 * dVar23) - dVar23 * (dVar21 - dVar30)) - dVar30 * dVar28);
    dVar39 = dVar39 * dVar14 - (dVar39 * dVar14 - dVar14);
    local_fd8 = (dVar14 - dVar39) * dVar36 -
                (((dVar49 - dVar39 * dVar16) - dVar16 * (dVar14 - dVar39)) - dVar39 * dVar36);
    iVar1 = 2;
    local_fd0 = dVar49;
  }
  else {
    local_fb8 = 0.0;
    local_fd8 = 0.0;
    iVar1 = 1;
  }
  if ((dVar19 != 0.0) || (NAN(dVar19))) {
    dVar16 = dVar19 * splitter - (dVar19 * splitter - dVar19);
    dVar21 = dVar19 - dVar16;
    dVar39 = dVar32 * splitter - (dVar32 * splitter - dVar32);
    local_ff8 = (dVar32 - dVar39) * dVar21 -
                (((dVar15 - dVar16 * dVar39) - dVar39 * dVar21) - dVar16 * (dVar32 - dVar39));
    if ((dVar38 == 0.0) && (!NAN(dVar38))) {
      dVar21 = -dVar19;
      dVar20 = dVar42 * dVar21;
      dVar39 = splitter * dVar21 - (dVar19 + splitter * dVar21);
      dVar16 = dVar42 * splitter - (dVar42 * splitter - dVar42);
      local_1018 = (dVar42 - dVar16) * (dVar21 - dVar39) -
                   (((dVar20 - dVar39 * dVar16) - dVar16 * (dVar21 - dVar39)) -
                   dVar39 * (dVar42 - dVar16));
      local_ff0 = dVar15;
      goto LAB_00161f64;
    }
    dVar28 = dVar38 * splitter - (dVar38 * splitter - dVar38);
    dVar30 = dVar38 - dVar28;
    dVar39 = dVar24 * splitter - (dVar24 * splitter - dVar24);
    dVar23 = (dVar24 - dVar39) * dVar30 -
             (((local_f98 - dVar28 * dVar39) - dVar39 * dVar30) - dVar28 * (dVar24 - dVar39));
    dVar39 = local_ff8 - dVar23;
    local_ff8 = (local_ff8 - (dVar39 + (local_ff8 - dVar39))) + ((local_ff8 - dVar39) - dVar23);
    dVar23 = dVar15 + dVar39;
    dVar39 = (dVar15 - (dVar23 - (dVar23 - dVar15))) + (dVar39 - (dVar23 - dVar15));
    dVar15 = dVar39 - local_f98;
    local_ff0 = (dVar39 - (dVar15 + (dVar39 - dVar15))) + ((dVar39 - dVar15) - local_f98);
    local_fe0 = dVar23 + dVar15;
    local_fe8 = (dVar23 - (local_fe0 - (local_fe0 - dVar23))) + (dVar15 - (local_fe0 - dVar23));
    dVar15 = dVar43 * splitter - (dVar43 * splitter - dVar43);
    dVar23 = (dVar43 - dVar15) * dVar30 -
             (((dVar20 - dVar28 * dVar15) - dVar15 * dVar30) - dVar28 * (dVar43 - dVar15));
    dVar15 = splitter * dVar42 - (splitter * dVar42 - dVar42);
    dVar15 = (dVar42 - dVar15) * dVar21 -
             (-dVar16 * (dVar42 - dVar15) + dVar15 * -dVar21 + -dVar16 * dVar15 + dVar29);
    dVar39 = dVar23 - dVar15;
    local_1018 = (dVar23 - (dVar39 + (dVar23 - dVar39))) + ((dVar23 - dVar39) - dVar15);
    dVar15 = dVar20 + dVar39;
    dVar16 = (dVar20 - (dVar15 - (dVar15 - dVar20))) + (dVar39 - (dVar15 - dVar20));
    dVar39 = dVar16 - dVar29;
    local_1010 = (dVar16 - (dVar39 + (dVar16 - dVar39))) + ((dVar16 - dVar39) - dVar29);
    local_1000 = dVar15 + dVar39;
    local_1008 = (dVar15 - (local_1000 - (local_1000 - dVar15))) + (dVar39 - (local_1000 - dVar15));
    iVar2 = 4;
  }
  else if ((dVar38 != 0.0) || (NAN(dVar38))) {
    dVar16 = -dVar38;
    dVar15 = splitter * dVar16 - (dVar38 + splitter * dVar16);
    dVar39 = dVar24 * splitter - (dVar24 * splitter - dVar24);
    local_ff8 = (dVar24 - dVar39) * (dVar16 - dVar15) -
                (((dVar24 * dVar16 - dVar15 * dVar39) - dVar39 * (dVar16 - dVar15)) -
                dVar15 * (dVar24 - dVar39));
    dVar39 = dVar38 * splitter - (dVar38 * splitter - dVar38);
    dVar15 = splitter * dVar43 - (splitter * dVar43 - dVar43);
    local_1018 = (dVar43 - dVar15) * (dVar38 - dVar39) -
                 (((dVar20 - dVar39 * dVar15) - dVar15 * (dVar38 - dVar39)) -
                 dVar39 * (dVar43 - dVar15));
    local_ff0 = dVar24 * dVar16;
LAB_00161f64:
    iVar2 = 2;
    local_1010 = dVar20;
  }
  else {
    local_ff8 = 0.0;
    local_1018 = 0.0;
    iVar2 = 1;
  }
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    dVar39 = dVar18 * splitter - (dVar18 * splitter - dVar18);
    dVar16 = dVar18 - dVar39;
    dVar15 = dVar42 * splitter - (dVar42 * splitter - dVar42);
    local_1038 = (dVar42 - dVar15) * dVar16 -
                 (((dVar26 - dVar39 * dVar15) - dVar15 * dVar16) - dVar39 * (dVar42 - dVar15));
    if ((dVar46 != 0.0) || (NAN(dVar46))) {
      dVar20 = dVar46 * splitter - (dVar46 * splitter - dVar46);
      dVar21 = dVar46 - dVar20;
      dVar15 = dVar43 * splitter - (dVar43 * splitter - dVar43);
      dVar23 = (dVar43 - dVar15) * dVar21 -
               (((dVar27 - dVar20 * dVar15) - dVar15 * dVar21) - dVar20 * (dVar43 - dVar15));
      dVar15 = local_1038 - dVar23;
      local_1038 = (local_1038 - (dVar15 + (local_1038 - dVar15))) +
                   ((local_1038 - dVar15) - dVar23);
      dVar23 = dVar26 + dVar15;
      dVar26 = (dVar26 - (dVar23 - (dVar23 - dVar26))) + (dVar15 - (dVar23 - dVar26));
      dVar15 = dVar26 - dVar27;
      local_1030 = (dVar26 - (dVar15 + (dVar26 - dVar15))) + ((dVar26 - dVar15) - dVar27);
      local_1020 = dVar23 + dVar15;
      local_1028 = (dVar23 - (local_1020 - (local_1020 - dVar23))) +
                   (dVar15 - (local_1020 - dVar23));
      dVar15 = dVar13 * splitter - (dVar13 * splitter - dVar13);
      dVar27 = (dVar13 - dVar15) * dVar21 -
               (((dVar12 - dVar20 * dVar15) - dVar15 * dVar21) - dVar20 * (dVar13 - dVar15));
      dVar15 = splitter * dVar17 - (splitter * dVar17 - dVar17);
      dVar15 = (dVar17 - dVar15) * dVar16 -
               (-dVar39 * (dVar17 - dVar15) + dVar15 * -dVar16 + -dVar39 * dVar15 + dVar25);
      dVar26 = dVar27 - dVar15;
      local_1058 = (dVar27 - (dVar26 + (dVar27 - dVar26))) + ((dVar27 - dVar26) - dVar15);
      dVar15 = dVar12 + dVar26;
      dVar26 = (dVar12 - (dVar15 - (dVar15 - dVar12))) + (dVar26 - (dVar15 - dVar12));
      dVar12 = dVar26 - dVar25;
      local_1050 = (dVar26 - (dVar12 + (dVar26 - dVar12))) + ((dVar26 - dVar12) - dVar25);
      local_1040 = dVar15 + dVar12;
      local_1048 = (dVar15 - (local_1040 - (local_1040 - dVar15))) +
                   (dVar12 - (local_1040 - dVar15));
      iVar3 = 4;
      goto LAB_00162750;
    }
    dVar15 = -dVar18;
    local_1050 = dVar17 * dVar15;
    dVar12 = splitter * dVar15 - (dVar18 + splitter * dVar15);
    dVar25 = dVar17 * splitter - (dVar17 * splitter - dVar17);
    local_1058 = (dVar17 - dVar25) * (dVar15 - dVar12) -
                 (((local_1050 - dVar12 * dVar25) - dVar25 * (dVar15 - dVar12)) -
                 dVar12 * (dVar17 - dVar25));
    local_1030 = dVar26;
  }
  else {
    if ((dVar46 == 0.0) && (!NAN(dVar46))) {
      local_1038 = 0.0;
      local_1058 = 0.0;
      iVar3 = 1;
      goto LAB_00162750;
    }
    dVar26 = -dVar46;
    dVar15 = splitter * dVar26 - (dVar46 + splitter * dVar26);
    dVar25 = dVar43 * splitter - (dVar43 * splitter - dVar43);
    local_1038 = (dVar43 - dVar25) * (dVar26 - dVar15) -
                 (((dVar43 * dVar26 - dVar15 * dVar25) - dVar25 * (dVar26 - dVar15)) -
                 dVar15 * (dVar43 - dVar25));
    dVar25 = dVar46 * splitter - (dVar46 * splitter - dVar46);
    dVar15 = splitter * dVar13 - (splitter * dVar13 - dVar13);
    local_1058 = (dVar13 - dVar15) * (dVar46 - dVar25) -
                 (((dVar12 - dVar25 * dVar15) - dVar15 * (dVar46 - dVar25)) -
                 dVar25 * (dVar13 - dVar15));
    local_1050 = dVar12;
    local_1030 = dVar43 * dVar26;
  }
  iVar3 = 2;
LAB_00162750:
  iVar4 = fast_expansion_sum_zeroelim(iVar2,&local_ff8,iVar3,&local_1058,local_db8);
  iVar5 = scale_expansion_zeroelim(iVar4,local_db8,dVar11,local_f18);
  pdVar8 = local_638;
  iVar5 = fast_expansion_sum_zeroelim(elen,pdVar7,iVar5,local_f18,pdVar8);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,&local_1038,iVar1,&local_fd8,local_df8);
  flen = scale_expansion_zeroelim(iVar3,local_df8,dVar37,local_f18);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,pdVar8,flen,local_f18,pdVar7);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,&local_fb8,iVar2,&local_1018,local_e38);
  iVar2 = scale_expansion_zeroelim(iVar1,local_e38,dVar33,local_f18);
  iVar2 = fast_expansion_sum_zeroelim(iVar5,pdVar7,iVar2,local_f18,pdVar8);
  if ((dVar34 != 0.0) || (NAN(dVar34))) {
    iVar5 = scale_expansion_zeroelim(4,&local_f38,dVar34,local_e98);
    pdVar7 = local_638;
    pdVar8 = local_c38;
    iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar7,iVar5,local_e98,pdVar8);
  }
  if ((dVar31 != 0.0) || (e = pdVar8, NAN(dVar31))) {
    iVar5 = scale_expansion_zeroelim(4,&local_f58,dVar31,local_e98);
    iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar8,iVar5,local_e98,pdVar7);
    e = pdVar7;
    pdVar7 = pdVar8;
  }
  if ((dVar22 != 0.0) || (pdVar8 = pdVar7, NAN(dVar22))) {
    iVar5 = scale_expansion_zeroelim(4,&local_f78,dVar22,local_e98);
    iVar2 = fast_expansion_sum_zeroelim(iVar2,e,iVar5,local_e98,pdVar7);
    pdVar8 = e;
    e = pdVar7;
  }
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    if ((dVar38 != 0.0) || (pdVar7 = pdVar8, pdVar9 = e, NAN(dVar38))) {
      dVar13 = dVar10 * dVar38;
      dVar12 = dVar10 * splitter - (dVar10 * splitter - dVar10);
      dVar15 = dVar38 * splitter - (dVar38 * splitter - dVar38);
      dVar39 = (dVar38 - dVar15) * (dVar10 - dVar12) -
               (((dVar13 - dVar12 * dVar15) - dVar15 * (dVar10 - dVar12)) -
               dVar12 * (dVar38 - dVar15));
      dVar25 = dVar33 * splitter - (dVar33 * splitter - dVar33);
      dVar26 = dVar33 - dVar25;
      dVar15 = dVar33 * dVar39;
      dVar12 = splitter * dVar39 - (splitter * dVar39 - dVar39);
      local_1088 = (dVar39 - dVar12) * dVar26 -
                   (((dVar15 - dVar12 * dVar25) - (dVar39 - dVar12) * dVar25) - dVar12 * dVar26);
      dVar27 = dVar13 * dVar33;
      dVar12 = splitter * dVar13 - (splitter * dVar13 - dVar13);
      dVar12 = (dVar13 - dVar12) * dVar26 -
               (((dVar27 - dVar12 * dVar25) - dVar25 * (dVar13 - dVar12)) - dVar12 * dVar26);
      local_1078 = dVar12 + dVar15;
      local_1080 = (dVar15 - (local_1078 - (local_1078 - dVar15))) +
                   (dVar12 - (local_1078 - dVar15));
      local_1070 = dVar27 + local_1078;
      local_1078 = local_1078 - (local_1070 - dVar27);
      iVar2 = fast_expansion_sum_zeroelim(iVar2,e,4,&local_1088,pdVar8);
      if ((dVar22 != 0.0) || (pdVar7 = e, pdVar9 = pdVar8, NAN(dVar22))) {
        dVar25 = dVar22 * splitter - (dVar22 * splitter - dVar22);
        dVar26 = dVar22 - dVar25;
        dVar12 = dVar22 * dVar39;
        dVar15 = dVar39 * splitter - (dVar39 * splitter - dVar39);
        local_1088 = (dVar39 - dVar15) * dVar26 -
                     (((dVar12 - dVar15 * dVar25) - (dVar39 - dVar15) * dVar25) - dVar15 * dVar26);
        dVar27 = dVar13 * dVar22;
        dVar15 = splitter * dVar13 - (splitter * dVar13 - dVar13);
        dVar15 = (dVar13 - dVar15) * dVar26 -
                 (((dVar27 - dVar15 * dVar25) - dVar25 * (dVar13 - dVar15)) - dVar15 * dVar26);
        local_1078 = dVar12 + dVar15;
        local_1080 = (dVar12 - (local_1078 - (local_1078 - dVar12))) +
                     (dVar15 - (local_1078 - dVar12));
        local_1070 = dVar27 + local_1078;
        local_1078 = local_1078 - (local_1070 - dVar27);
        iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar8,4,&local_1088,e);
        pdVar7 = pdVar8;
        pdVar9 = e;
      }
    }
    if ((dVar46 != 0.0) || (pdVar8 = pdVar7, e = pdVar9, NAN(dVar46))) {
      dVar12 = -dVar10;
      dVar27 = dVar46 * dVar12;
      dVar10 = splitter * dVar12 - (dVar10 + splitter * dVar12);
      dVar15 = dVar46 * splitter - (dVar46 * splitter - dVar46);
      dVar39 = (dVar46 - dVar15) * (dVar12 - dVar10) -
               (((dVar27 - dVar10 * dVar15) - dVar15 * (dVar12 - dVar10)) -
               dVar10 * (dVar46 - dVar15));
      dVar15 = dVar37 * splitter - (dVar37 * splitter - dVar37);
      dVar25 = dVar37 - dVar15;
      dVar10 = dVar37 * dVar39;
      dVar12 = splitter * dVar39 - (splitter * dVar39 - dVar39);
      local_1088 = (dVar39 - dVar12) * dVar25 -
                   (((dVar10 - dVar12 * dVar15) - (dVar39 - dVar12) * dVar15) - dVar12 * dVar25);
      dVar26 = dVar37 * dVar27;
      dVar12 = splitter * dVar27 - (splitter * dVar27 - dVar27);
      dVar12 = (dVar27 - dVar12) * dVar25 -
               (((dVar26 - dVar12 * dVar15) - dVar15 * (dVar27 - dVar12)) - dVar12 * dVar25);
      local_1078 = dVar12 + dVar10;
      local_1080 = (dVar10 - (local_1078 - (local_1078 - dVar10))) +
                   (dVar12 - (local_1078 - dVar10));
      local_1070 = dVar26 + local_1078;
      local_1078 = local_1078 - (local_1070 - dVar26);
      iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar9,4,&local_1088,pdVar7);
      if ((dVar31 != 0.0) || (pdVar8 = pdVar9, e = pdVar7, NAN(dVar31))) {
        dVar15 = dVar31 * splitter - (dVar31 * splitter - dVar31);
        dVar25 = dVar31 - dVar15;
        dVar12 = dVar31 * dVar39;
        dVar10 = dVar39 * splitter - (dVar39 * splitter - dVar39);
        local_1088 = (dVar39 - dVar10) * dVar25 -
                     (((dVar12 - dVar10 * dVar15) - (dVar39 - dVar10) * dVar15) - dVar10 * dVar25);
        dVar26 = dVar27 * dVar31;
        dVar10 = splitter * dVar27 - (splitter * dVar27 - dVar27);
        dVar10 = (dVar27 - dVar10) * dVar25 -
                 (((dVar26 - dVar10 * dVar15) - dVar15 * (dVar27 - dVar10)) - dVar10 * dVar25);
        local_1078 = dVar12 + dVar10;
        local_1080 = (dVar12 - (local_1078 - (local_1078 - dVar12))) +
                     (dVar10 - (local_1078 - dVar12));
        local_1070 = dVar26 + local_1078;
        local_1078 = local_1078 - (local_1070 - dVar26);
        iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar7,4,&local_1088,pdVar9);
        pdVar8 = pdVar7;
        e = pdVar9;
      }
    }
  }
  if ((dVar19 != 0.0) || (NAN(dVar19))) {
    if ((dVar46 != 0.0) || (pdVar7 = pdVar8, pdVar9 = e, NAN(dVar46))) {
      dVar27 = dVar19 * dVar46;
      dVar12 = dVar19 * splitter - (dVar19 * splitter - dVar19);
      dVar10 = dVar46 * splitter - (dVar46 * splitter - dVar46);
      dVar26 = (dVar46 - dVar10) * (dVar19 - dVar12) -
               (((dVar27 - dVar12 * dVar10) - dVar10 * (dVar19 - dVar12)) -
               dVar12 * (dVar46 - dVar10));
      dVar10 = dVar11 * splitter - (dVar11 * splitter - dVar11);
      dVar15 = dVar11 - dVar10;
      dVar12 = dVar11 * dVar26;
      dVar46 = splitter * dVar26 - (splitter * dVar26 - dVar26);
      local_1088 = (dVar26 - dVar46) * dVar15 -
                   (((dVar12 - dVar46 * dVar10) - (dVar26 - dVar46) * dVar10) - dVar46 * dVar15);
      dVar25 = dVar11 * dVar27;
      dVar46 = splitter * dVar27 - (splitter * dVar27 - dVar27);
      dVar46 = (dVar27 - dVar46) * dVar15 -
               (((dVar25 - dVar46 * dVar10) - dVar10 * (dVar27 - dVar46)) - dVar46 * dVar15);
      local_1078 = dVar46 + dVar12;
      local_1080 = (dVar12 - (local_1078 - (local_1078 - dVar12))) +
                   (dVar46 - (local_1078 - dVar12));
      local_1070 = dVar25 + local_1078;
      local_1078 = local_1078 - (local_1070 - dVar25);
      iVar2 = fast_expansion_sum_zeroelim(iVar2,e,4,&local_1088,pdVar8);
      if ((dVar34 != 0.0) || (pdVar7 = e, pdVar9 = pdVar8, NAN(dVar34))) {
        dVar12 = dVar34 * splitter - (dVar34 * splitter - dVar34);
        dVar10 = dVar34 - dVar12;
        dVar25 = dVar34 * dVar26;
        dVar46 = dVar26 * splitter - (dVar26 * splitter - dVar26);
        local_1088 = (dVar26 - dVar46) * dVar10 -
                     (((dVar25 - dVar46 * dVar12) - (dVar26 - dVar46) * dVar12) - dVar46 * dVar10);
        dVar15 = dVar27 * dVar34;
        dVar46 = splitter * dVar27 - (splitter * dVar27 - dVar27);
        dVar46 = (dVar27 - dVar46) * dVar10 -
                 (((dVar15 - dVar46 * dVar12) - dVar12 * (dVar27 - dVar46)) - dVar46 * dVar10);
        local_1078 = dVar25 + dVar46;
        local_1080 = (dVar25 - (local_1078 - (local_1078 - dVar25))) +
                     (dVar46 - (local_1078 - dVar25));
        local_1070 = dVar15 + local_1078;
        local_1078 = local_1078 - (local_1070 - dVar15);
        iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar8,4,&local_1088,e);
        pdVar7 = pdVar8;
        pdVar9 = e;
      }
    }
    if ((dVar14 != 0.0) || (pdVar8 = pdVar7, e = pdVar9, NAN(dVar14))) {
      dVar46 = -dVar19;
      dVar26 = dVar14 * dVar46;
      dVar12 = splitter * dVar46 - (dVar19 + splitter * dVar46);
      dVar10 = dVar14 * splitter - (dVar14 * splitter - dVar14);
      dVar25 = (dVar14 - dVar10) * (dVar46 - dVar12) -
               (((dVar26 - dVar12 * dVar10) - dVar10 * (dVar46 - dVar12)) -
               dVar12 * (dVar14 - dVar10));
      dVar10 = dVar33 * splitter - (dVar33 * splitter - dVar33);
      dVar15 = dVar33 - dVar10;
      dVar12 = dVar33 * dVar25;
      dVar46 = splitter * dVar25 - (splitter * dVar25 - dVar25);
      local_1088 = (dVar25 - dVar46) * dVar15 -
                   (((dVar12 - dVar46 * dVar10) - (dVar25 - dVar46) * dVar10) - dVar46 * dVar15);
      dVar33 = dVar33 * dVar26;
      dVar46 = splitter * dVar26 - (splitter * dVar26 - dVar26);
      dVar46 = (dVar26 - dVar46) * dVar15 -
               (((dVar33 - dVar46 * dVar10) - dVar10 * (dVar26 - dVar46)) - dVar46 * dVar15);
      local_1078 = dVar46 + dVar12;
      local_1080 = (dVar12 - (local_1078 - (local_1078 - dVar12))) +
                   (dVar46 - (local_1078 - dVar12));
      local_1070 = dVar33 + local_1078;
      local_1078 = local_1078 - (local_1070 - dVar33);
      iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar9,4,&local_1088,pdVar7);
      if ((dVar22 != 0.0) || (pdVar8 = pdVar9, e = pdVar7, NAN(dVar22))) {
        dVar10 = dVar22 * splitter - (dVar22 * splitter - dVar22);
        dVar15 = dVar22 - dVar10;
        dVar46 = dVar22 * dVar25;
        dVar12 = dVar25 * splitter - (dVar25 * splitter - dVar25);
        local_1088 = (dVar25 - dVar12) * dVar15 -
                     (((dVar46 - dVar12 * dVar10) - (dVar25 - dVar12) * dVar10) - dVar12 * dVar15);
        dVar25 = dVar26 * dVar22;
        dVar12 = splitter * dVar26 - (splitter * dVar26 - dVar26);
        dVar12 = (dVar26 - dVar12) * dVar15 -
                 (((dVar25 - dVar12 * dVar10) - dVar10 * (dVar26 - dVar12)) - dVar12 * dVar15);
        local_1078 = dVar46 + dVar12;
        local_1080 = (dVar46 - (local_1078 - (local_1078 - dVar46))) +
                     (dVar12 - (local_1078 - dVar46));
        local_1070 = dVar25 + local_1078;
        local_1078 = local_1078 - (local_1070 - dVar25);
        iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar7,4,&local_1088,pdVar9);
        pdVar8 = pdVar7;
        e = pdVar9;
      }
    }
  }
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    if ((dVar14 != 0.0) || (pdVar7 = pdVar8, pdVar9 = e, NAN(dVar14))) {
      dVar25 = dVar18 * dVar14;
      dVar46 = dVar18 * splitter - (dVar18 * splitter - dVar18);
      dVar12 = dVar14 * splitter - (dVar14 * splitter - dVar14);
      dVar15 = (dVar14 - dVar12) * (dVar18 - dVar46) -
               (((dVar25 - dVar46 * dVar12) - dVar12 * (dVar18 - dVar46)) -
               dVar46 * (dVar14 - dVar12));
      dVar10 = dVar37 * splitter - (dVar37 * splitter - dVar37);
      dVar14 = dVar37 - dVar10;
      dVar12 = dVar37 * dVar15;
      dVar46 = splitter * dVar15 - (splitter * dVar15 - dVar15);
      local_1088 = (dVar15 - dVar46) * dVar14 -
                   (((dVar12 - dVar46 * dVar10) - (dVar15 - dVar46) * dVar10) - dVar46 * dVar14);
      dVar37 = dVar37 * dVar25;
      dVar46 = splitter * dVar25 - (splitter * dVar25 - dVar25);
      dVar46 = (dVar25 - dVar46) * dVar14 -
               (((dVar37 - dVar46 * dVar10) - dVar10 * (dVar25 - dVar46)) - dVar46 * dVar14);
      local_1078 = dVar46 + dVar12;
      local_1080 = (dVar12 - (local_1078 - (local_1078 - dVar12))) +
                   (dVar46 - (local_1078 - dVar12));
      local_1070 = dVar37 + local_1078;
      local_1078 = local_1078 - (local_1070 - dVar37);
      iVar2 = fast_expansion_sum_zeroelim(iVar2,e,4,&local_1088,pdVar8);
      if ((dVar31 != 0.0) || (pdVar7 = e, pdVar9 = pdVar8, NAN(dVar31))) {
        dVar10 = dVar31 * splitter - (dVar31 * splitter - dVar31);
        dVar14 = dVar31 - dVar10;
        dVar46 = dVar31 * dVar15;
        dVar12 = dVar15 * splitter - (dVar15 * splitter - dVar15);
        local_1088 = (dVar15 - dVar12) * dVar14 -
                     (((dVar46 - dVar12 * dVar10) - (dVar15 - dVar12) * dVar10) - dVar12 * dVar14);
        dVar15 = dVar25 * dVar31;
        dVar12 = splitter * dVar25 - (splitter * dVar25 - dVar25);
        dVar12 = (dVar25 - dVar12) * dVar14 -
                 (((dVar15 - dVar12 * dVar10) - dVar10 * (dVar25 - dVar12)) - dVar12 * dVar14);
        local_1078 = dVar46 + dVar12;
        local_1080 = (dVar46 - (local_1078 - (local_1078 - dVar46))) +
                     (dVar12 - (local_1078 - dVar46));
        local_1070 = dVar15 + local_1078;
        local_1078 = local_1078 - (local_1070 - dVar15);
        iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar8,4,&local_1088,e);
        pdVar7 = pdVar8;
        pdVar9 = e;
      }
    }
    if ((dVar38 != 0.0) || (pdVar8 = pdVar7, e = pdVar9, NAN(dVar38))) {
      dVar46 = -dVar18;
      dVar15 = dVar38 * dVar46;
      dVar12 = splitter * dVar46 - (dVar18 + splitter * dVar46);
      dVar10 = dVar38 * splitter - (dVar38 * splitter - dVar38);
      dVar14 = (dVar38 - dVar10) * (dVar46 - dVar12) -
               (((dVar15 - dVar12 * dVar10) - dVar10 * (dVar46 - dVar12)) -
               dVar12 * (dVar38 - dVar10));
      dVar12 = dVar11 * splitter - (dVar11 * splitter - dVar11);
      dVar10 = dVar11 - dVar12;
      dVar46 = dVar11 * dVar14;
      dVar38 = splitter * dVar14 - (splitter * dVar14 - dVar14);
      local_1088 = (dVar14 - dVar38) * dVar10 -
                   (((dVar46 - dVar38 * dVar12) - (dVar14 - dVar38) * dVar12) - dVar38 * dVar10);
      dVar11 = dVar11 * dVar15;
      dVar38 = splitter * dVar15 - (splitter * dVar15 - dVar15);
      dVar38 = (dVar15 - dVar38) * dVar10 -
               (((dVar11 - dVar38 * dVar12) - dVar12 * (dVar15 - dVar38)) - dVar38 * dVar10);
      local_1078 = dVar38 + dVar46;
      local_1080 = (dVar46 - (local_1078 - (local_1078 - dVar46))) +
                   (dVar38 - (local_1078 - dVar46));
      local_1070 = dVar11 + local_1078;
      local_1078 = local_1078 - (local_1070 - dVar11);
      iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar9,4,&local_1088,pdVar7);
      if ((dVar34 != 0.0) || (pdVar8 = pdVar9, e = pdVar7, NAN(dVar34))) {
        dVar46 = dVar34 * splitter - (dVar34 * splitter - dVar34);
        dVar12 = dVar34 - dVar46;
        dVar25 = dVar34 * dVar14;
        dVar38 = dVar14 * splitter - (dVar14 * splitter - dVar14);
        local_1088 = (dVar14 - dVar38) * dVar12 -
                     (((dVar25 - dVar38 * dVar46) - (dVar14 - dVar38) * dVar46) - dVar38 * dVar12);
        dVar10 = dVar15 * dVar34;
        dVar38 = splitter * dVar15 - (splitter * dVar15 - dVar15);
        dVar38 = (dVar15 - dVar38) * dVar12 -
                 (((dVar10 - dVar38 * dVar46) - dVar46 * (dVar15 - dVar38)) - dVar38 * dVar12);
        local_1078 = dVar25 + dVar38;
        local_1080 = (dVar25 - (local_1078 - (local_1078 - dVar25))) +
                     (dVar38 - (local_1078 - dVar25));
        local_1070 = dVar10 + local_1078;
        local_1078 = local_1078 - (local_1070 - dVar10);
        iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar7,4,&local_1088,pdVar9);
        pdVar8 = pdVar7;
        e = pdVar9;
      }
    }
  }
  if ((dVar34 != 0.0) || (pdVar7 = pdVar8, NAN(dVar34))) {
    iVar4 = scale_expansion_zeroelim(iVar4,local_db8,dVar34,local_f18);
    iVar2 = fast_expansion_sum_zeroelim(iVar2,e,iVar4,local_f18,pdVar8);
    pdVar7 = e;
    e = pdVar8;
  }
  if ((dVar31 != 0.0) || (pdVar8 = e, NAN(dVar31))) {
    iVar3 = scale_expansion_zeroelim(iVar3,local_df8,dVar31,local_f18);
    iVar2 = fast_expansion_sum_zeroelim(iVar2,e,iVar3,local_f18,pdVar7);
    pdVar8 = pdVar7;
    pdVar7 = e;
  }
  if ((dVar22 != 0.0) || (NAN(dVar22))) {
    iVar1 = scale_expansion_zeroelim(iVar1,local_e38,dVar22,local_f18);
    iVar2 = fast_expansion_sum_zeroelim(iVar2,pdVar8,iVar1,local_f18,pdVar7);
    pdVar8 = pdVar7;
  }
  return pdVar8[(long)iVar2 + -1];
}

Assistant:

REAL orient3dadapt(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL permanent)
{
  INEXACT REAL adx, bdx, cdx, ady, bdy, cdy, adz, bdz, cdz;
  REAL det, errbound;

  INEXACT REAL bdxcdy1, cdxbdy1, cdxady1, adxcdy1, adxbdy1, bdxady1;
  REAL bdxcdy0, cdxbdy0, cdxady0, adxcdy0, adxbdy0, bdxady0;
  REAL bc[4], ca[4], ab[4];
  INEXACT REAL bc3, ca3, ab3;
  REAL adet[8], bdet[8], cdet[8];
  int alen, blen, clen;
  REAL abdet[16];
  int ablen;
  REAL *finnow, *finother, *finswap;
  REAL fin1[192], fin2[192];
  int finlength;


  REAL adxtail, bdxtail, cdxtail;
  REAL adytail, bdytail, cdytail;
  REAL adztail, bdztail, cdztail;
  INEXACT REAL at_blarge, at_clarge;
  INEXACT REAL bt_clarge, bt_alarge;
  INEXACT REAL ct_alarge, ct_blarge;
  REAL at_b[4], at_c[4], bt_c[4], bt_a[4], ct_a[4], ct_b[4];
  int at_blen, at_clen, bt_clen, bt_alen, ct_alen, ct_blen;
  INEXACT REAL bdxt_cdy1, cdxt_bdy1, cdxt_ady1;
  INEXACT REAL adxt_cdy1, adxt_bdy1, bdxt_ady1;
  REAL bdxt_cdy0, cdxt_bdy0, cdxt_ady0;
  REAL adxt_cdy0, adxt_bdy0, bdxt_ady0;
  INEXACT REAL bdyt_cdx1, cdyt_bdx1, cdyt_adx1;
  INEXACT REAL adyt_cdx1, adyt_bdx1, bdyt_adx1;
  REAL bdyt_cdx0, cdyt_bdx0, cdyt_adx0;
  REAL adyt_cdx0, adyt_bdx0, bdyt_adx0;
  REAL bct[8], cat[8], abt[8];
  int bctlen, catlen, abtlen;
  INEXACT REAL bdxt_cdyt1, cdxt_bdyt1, cdxt_adyt1;
  INEXACT REAL adxt_cdyt1, adxt_bdyt1, bdxt_adyt1;
  REAL bdxt_cdyt0, cdxt_bdyt0, cdxt_adyt0;
  REAL adxt_cdyt0, adxt_bdyt0, bdxt_adyt0;
  REAL u[4], v[12], w[16];
  INEXACT REAL u3;
  int vlength, wlength;
  REAL negate;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k;
  REAL _0;


  adx = (REAL) (pa[0] - pd[0]);
  bdx = (REAL) (pb[0] - pd[0]);
  cdx = (REAL) (pc[0] - pd[0]);
  ady = (REAL) (pa[1] - pd[1]);
  bdy = (REAL) (pb[1] - pd[1]);
  cdy = (REAL) (pc[1] - pd[1]);
  adz = (REAL) (pa[2] - pd[2]);
  bdz = (REAL) (pb[2] - pd[2]);
  cdz = (REAL) (pc[2] - pd[2]);

  Two_Product(bdx, cdy, bdxcdy1, bdxcdy0);
  Two_Product(cdx, bdy, cdxbdy1, cdxbdy0);
  Two_Two_Diff(bdxcdy1, bdxcdy0, cdxbdy1, cdxbdy0, bc3, bc[2], bc[1], bc[0]);
  bc[3] = bc3;
  alen = scale_expansion_zeroelim(4, bc, adz, adet);

  Two_Product(cdx, ady, cdxady1, cdxady0);
  Two_Product(adx, cdy, adxcdy1, adxcdy0);
  Two_Two_Diff(cdxady1, cdxady0, adxcdy1, adxcdy0, ca3, ca[2], ca[1], ca[0]);
  ca[3] = ca3;
  blen = scale_expansion_zeroelim(4, ca, bdz, bdet);

  Two_Product(adx, bdy, adxbdy1, adxbdy0);
  Two_Product(bdx, ady, bdxady1, bdxady0);
  Two_Two_Diff(adxbdy1, adxbdy0, bdxady1, bdxady0, ab3, ab[2], ab[1], ab[0]);
  ab[3] = ab3;
  clen = scale_expansion_zeroelim(4, ab, cdz, cdet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  finlength = fast_expansion_sum_zeroelim(ablen, abdet, clen, cdet, fin1);

  det = estimate(finlength, fin1);
  errbound = o3derrboundB * permanent;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pd[0], adx, adxtail);
  Two_Diff_Tail(pb[0], pd[0], bdx, bdxtail);
  Two_Diff_Tail(pc[0], pd[0], cdx, cdxtail);
  Two_Diff_Tail(pa[1], pd[1], ady, adytail);
  Two_Diff_Tail(pb[1], pd[1], bdy, bdytail);
  Two_Diff_Tail(pc[1], pd[1], cdy, cdytail);
  Two_Diff_Tail(pa[2], pd[2], adz, adztail);
  Two_Diff_Tail(pb[2], pd[2], bdz, bdztail);
  Two_Diff_Tail(pc[2], pd[2], cdz, cdztail);

  if ((adxtail == 0.0) && (bdxtail == 0.0) && (cdxtail == 0.0)
      && (adytail == 0.0) && (bdytail == 0.0) && (cdytail == 0.0)
      && (adztail == 0.0) && (bdztail == 0.0) && (cdztail == 0.0)) {
    return det;
  }

  errbound = o3derrboundC * permanent + resulterrbound * Absolute(det);
  det += (adz * ((bdx * cdytail + cdy * bdxtail)
                 - (bdy * cdxtail + cdx * bdytail))
          + adztail * (bdx * cdy - bdy * cdx))
       + (bdz * ((cdx * adytail + ady * cdxtail)
                 - (cdy * adxtail + adx * cdytail))
          + bdztail * (cdx * ady - cdy * adx))
       + (cdz * ((adx * bdytail + bdy * adxtail)
                 - (ady * bdxtail + bdx * adytail))
          + cdztail * (adx * bdy - ady * bdx));
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  finnow = fin1;
  finother = fin2;

  if (adxtail == 0.0) {
    if (adytail == 0.0) {
      at_b[0] = 0.0;
      at_blen = 1;
      at_c[0] = 0.0;
      at_clen = 1;
    } else {
      negate = -adytail;
      Two_Product(negate, bdx, at_blarge, at_b[0]);
      at_b[1] = at_blarge;
      at_blen = 2;
      Two_Product(adytail, cdx, at_clarge, at_c[0]);
      at_c[1] = at_clarge;
      at_clen = 2;
    }
  } else {
    if (adytail == 0.0) {
      Two_Product(adxtail, bdy, at_blarge, at_b[0]);
      at_b[1] = at_blarge;
      at_blen = 2;
      negate = -adxtail;
      Two_Product(negate, cdy, at_clarge, at_c[0]);
      at_c[1] = at_clarge;
      at_clen = 2;
    } else {
      Two_Product(adxtail, bdy, adxt_bdy1, adxt_bdy0);
      Two_Product(adytail, bdx, adyt_bdx1, adyt_bdx0);
      Two_Two_Diff(adxt_bdy1, adxt_bdy0, adyt_bdx1, adyt_bdx0,
                   at_blarge, at_b[2], at_b[1], at_b[0]);
      at_b[3] = at_blarge;
      at_blen = 4;
      Two_Product(adytail, cdx, adyt_cdx1, adyt_cdx0);
      Two_Product(adxtail, cdy, adxt_cdy1, adxt_cdy0);
      Two_Two_Diff(adyt_cdx1, adyt_cdx0, adxt_cdy1, adxt_cdy0,
                   at_clarge, at_c[2], at_c[1], at_c[0]);
      at_c[3] = at_clarge;
      at_clen = 4;
    }
  }
  if (bdxtail == 0.0) {
    if (bdytail == 0.0) {
      bt_c[0] = 0.0;
      bt_clen = 1;
      bt_a[0] = 0.0;
      bt_alen = 1;
    } else {
      negate = -bdytail;
      Two_Product(negate, cdx, bt_clarge, bt_c[0]);
      bt_c[1] = bt_clarge;
      bt_clen = 2;
      Two_Product(bdytail, adx, bt_alarge, bt_a[0]);
      bt_a[1] = bt_alarge;
      bt_alen = 2;
    }
  } else {
    if (bdytail == 0.0) {
      Two_Product(bdxtail, cdy, bt_clarge, bt_c[0]);
      bt_c[1] = bt_clarge;
      bt_clen = 2;
      negate = -bdxtail;
      Two_Product(negate, ady, bt_alarge, bt_a[0]);
      bt_a[1] = bt_alarge;
      bt_alen = 2;
    } else {
      Two_Product(bdxtail, cdy, bdxt_cdy1, bdxt_cdy0);
      Two_Product(bdytail, cdx, bdyt_cdx1, bdyt_cdx0);
      Two_Two_Diff(bdxt_cdy1, bdxt_cdy0, bdyt_cdx1, bdyt_cdx0,
                   bt_clarge, bt_c[2], bt_c[1], bt_c[0]);
      bt_c[3] = bt_clarge;
      bt_clen = 4;
      Two_Product(bdytail, adx, bdyt_adx1, bdyt_adx0);
      Two_Product(bdxtail, ady, bdxt_ady1, bdxt_ady0);
      Two_Two_Diff(bdyt_adx1, bdyt_adx0, bdxt_ady1, bdxt_ady0,
                  bt_alarge, bt_a[2], bt_a[1], bt_a[0]);
      bt_a[3] = bt_alarge;
      bt_alen = 4;
    }
  }
  if (cdxtail == 0.0) {
    if (cdytail == 0.0) {
      ct_a[0] = 0.0;
      ct_alen = 1;
      ct_b[0] = 0.0;
      ct_blen = 1;
    } else {
      negate = -cdytail;
      Two_Product(negate, adx, ct_alarge, ct_a[0]);
      ct_a[1] = ct_alarge;
      ct_alen = 2;
      Two_Product(cdytail, bdx, ct_blarge, ct_b[0]);
      ct_b[1] = ct_blarge;
      ct_blen = 2;
    }
  } else {
    if (cdytail == 0.0) {
      Two_Product(cdxtail, ady, ct_alarge, ct_a[0]);
      ct_a[1] = ct_alarge;
      ct_alen = 2;
      negate = -cdxtail;
      Two_Product(negate, bdy, ct_blarge, ct_b[0]);
      ct_b[1] = ct_blarge;
      ct_blen = 2;
    } else {
      Two_Product(cdxtail, ady, cdxt_ady1, cdxt_ady0);
      Two_Product(cdytail, adx, cdyt_adx1, cdyt_adx0);
      Two_Two_Diff(cdxt_ady1, cdxt_ady0, cdyt_adx1, cdyt_adx0,
                   ct_alarge, ct_a[2], ct_a[1], ct_a[0]);
      ct_a[3] = ct_alarge;
      ct_alen = 4;
      Two_Product(cdytail, bdx, cdyt_bdx1, cdyt_bdx0);
      Two_Product(cdxtail, bdy, cdxt_bdy1, cdxt_bdy0);
      Two_Two_Diff(cdyt_bdx1, cdyt_bdx0, cdxt_bdy1, cdxt_bdy0,
                   ct_blarge, ct_b[2], ct_b[1], ct_b[0]);
      ct_b[3] = ct_blarge;
      ct_blen = 4;
    }
  }

  bctlen = fast_expansion_sum_zeroelim(bt_clen, bt_c, ct_blen, ct_b, bct);
  wlength = scale_expansion_zeroelim(bctlen, bct, adz, w);
  finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                          finother);
  finswap = finnow; finnow = finother; finother = finswap;

  catlen = fast_expansion_sum_zeroelim(ct_alen, ct_a, at_clen, at_c, cat);
  wlength = scale_expansion_zeroelim(catlen, cat, bdz, w);
  finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                          finother);
  finswap = finnow; finnow = finother; finother = finswap;

  abtlen = fast_expansion_sum_zeroelim(at_blen, at_b, bt_alen, bt_a, abt);
  wlength = scale_expansion_zeroelim(abtlen, abt, cdz, w);
  finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                          finother);
  finswap = finnow; finnow = finother; finother = finswap;

  if (adztail != 0.0) {
    vlength = scale_expansion_zeroelim(4, bc, adztail, v);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, vlength, v,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (bdztail != 0.0) {
    vlength = scale_expansion_zeroelim(4, ca, bdztail, v);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, vlength, v,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (cdztail != 0.0) {
    vlength = scale_expansion_zeroelim(4, ab, cdztail, v);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, vlength, v,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }

  if (adxtail != 0.0) {
    if (bdytail != 0.0) {
      Two_Product(adxtail, bdytail, adxt_bdyt1, adxt_bdyt0);
      Two_One_Product(adxt_bdyt1, adxt_bdyt0, cdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (cdztail != 0.0) {
        Two_One_Product(adxt_bdyt1, adxt_bdyt0, cdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
    if (cdytail != 0.0) {
      negate = -adxtail;
      Two_Product(negate, cdytail, adxt_cdyt1, adxt_cdyt0);
      Two_One_Product(adxt_cdyt1, adxt_cdyt0, bdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (bdztail != 0.0) {
        Two_One_Product(adxt_cdyt1, adxt_cdyt0, bdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
  }
  if (bdxtail != 0.0) {
    if (cdytail != 0.0) {
      Two_Product(bdxtail, cdytail, bdxt_cdyt1, bdxt_cdyt0);
      Two_One_Product(bdxt_cdyt1, bdxt_cdyt0, adz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (adztail != 0.0) {
        Two_One_Product(bdxt_cdyt1, bdxt_cdyt0, adztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
    if (adytail != 0.0) {
      negate = -bdxtail;
      Two_Product(negate, adytail, bdxt_adyt1, bdxt_adyt0);
      Two_One_Product(bdxt_adyt1, bdxt_adyt0, cdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (cdztail != 0.0) {
        Two_One_Product(bdxt_adyt1, bdxt_adyt0, cdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
  }
  if (cdxtail != 0.0) {
    if (adytail != 0.0) {
      Two_Product(cdxtail, adytail, cdxt_adyt1, cdxt_adyt0);
      Two_One_Product(cdxt_adyt1, cdxt_adyt0, bdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (bdztail != 0.0) {
        Two_One_Product(cdxt_adyt1, cdxt_adyt0, bdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
    if (bdytail != 0.0) {
      negate = -cdxtail;
      Two_Product(negate, bdytail, cdxt_bdyt1, cdxt_bdyt0);
      Two_One_Product(cdxt_bdyt1, cdxt_bdyt0, adz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (adztail != 0.0) {
        Two_One_Product(cdxt_bdyt1, cdxt_bdyt0, adztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
  }

  if (adztail != 0.0) {
    wlength = scale_expansion_zeroelim(bctlen, bct, adztail, w);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (bdztail != 0.0) {
    wlength = scale_expansion_zeroelim(catlen, cat, bdztail, w);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (cdztail != 0.0) {
    wlength = scale_expansion_zeroelim(abtlen, abt, cdztail, w);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }

  return finnow[finlength - 1];
}